

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall kj::_::Debug::Context::onFatalException(Context *this,Exception *exception)

{
  ExceptionCallback *pEVar1;
  ArrayDisposer *this_00;
  String *description;
  Exception *pEVar2;
  undefined1 local_40 [8];
  Value_conflict v;
  Exception *exception_local;
  Context *this_local;
  
  v.description.content.disposer = (ArrayDisposer *)exception;
  ensureInitialized((Value_conflict *)local_40,this);
  this_00 = v.description.content.disposer;
  description = mv<kj::String>((String *)&v.line);
  Exception::wrapContext((Exception *)this_00,(char *)local_40,(int)v.file,description);
  pEVar1 = (this->super_ExceptionCallback).next;
  pEVar2 = mv<kj::Exception>((Exception *)v.description.content.disposer);
  (*pEVar1->_vptr_ExceptionCallback[3])(pEVar1,pEVar2);
  Value::~Value((Value *)local_40);
  return;
}

Assistant:

void Debug::Context::onFatalException(Exception&& exception) {
  Value v = ensureInitialized();
  exception.wrapContext(v.file, v.line, mv(v.description));
  next.onFatalException(kj::mv(exception));
}